

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVec3faBuffer
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *positions_in,Transformations *spaces)

{
  float *pfVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pvVar8;
  pointer pvVar9;
  size_t sVar10;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar11;
  Vec3fa *pVVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  long lVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  AffineSpace3ff space;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  undefined8 uStack_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = (positions_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar9 = (positions_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar27 = (long)pvVar9 - (long)pvVar8;
  sVar10 = pvVar8->size_active;
  if (lVar27 == 0x20) {
    if ((spaces->spaces).size_active != 0) {
      uVar28 = 0;
      do {
        local_78._8_8_ = 0;
        uStack_68 = 0;
        uStack_60 = (void *)0x0;
        if (sVar10 != 0) {
          uStack_60 = alignedMalloc(sVar10 << 4,0x10);
          lVar27 = 0;
          sVar26 = sVar10;
          do {
            pAVar11 = (spaces->spaces).items;
            pVVar12 = ((positions_in->
                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->items;
            fVar5 = *(float *)((long)&pVVar12->field_0 + lVar27);
            fVar6 = *(float *)((long)&pVVar12->field_0 + lVar27 + 4);
            fVar7 = *(float *)((long)&pVVar12->field_0 + lVar27 + 8);
            pVVar2 = &pAVar11[uVar28].l.vz;
            fVar13 = (pVVar2->field_0).m128[1];
            fVar14 = (pVVar2->field_0).m128[2];
            fVar15 = (pVVar2->field_0).m128[3];
            pVVar3 = &pAVar11[uVar28].p;
            fVar16 = (pVVar3->field_0).m128[1];
            fVar17 = (pVVar3->field_0).m128[2];
            fVar18 = (pVVar3->field_0).m128[3];
            pVVar4 = &pAVar11[uVar28].l.vy;
            fVar19 = (pVVar4->field_0).m128[1];
            fVar20 = (pVVar4->field_0).m128[2];
            fVar21 = (pVVar4->field_0).m128[3];
            pAVar11 = pAVar11 + uVar28;
            fVar22 = (pAVar11->l).vx.field_0.m128[1];
            fVar23 = (pAVar11->l).vx.field_0.m128[2];
            fVar24 = (pAVar11->l).vx.field_0.m128[3];
            pfVar1 = (float *)((long)uStack_60 + lVar27);
            *pfVar1 = fVar5 * (pAVar11->l).vx.field_0.m128[0] +
                      fVar6 * (pVVar4->field_0).m128[0] +
                      fVar7 * (pVVar2->field_0).m128[0] + (pVVar3->field_0).m128[0];
            pfVar1[1] = fVar5 * fVar22 + fVar6 * fVar19 + fVar7 * fVar13 + fVar16;
            pfVar1[2] = fVar5 * fVar23 + fVar6 * fVar20 + fVar7 * fVar14 + fVar17;
            pfVar1[3] = fVar5 * fVar24 + fVar6 * fVar21 + fVar7 * fVar15 + fVar18;
            lVar27 = lVar27 + 0x10;
            sVar26 = sVar26 - 1;
            uStack_68 = sVar10;
          } while (sVar26 != 0);
        }
        local_78._8_8_ = uStack_68;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_78.field_1);
        alignedFree(uStack_60);
        uVar28 = uVar28 + 1;
      } while (uVar28 < (spaces->spaces).size_active);
    }
  }
  else if (pvVar9 != pvVar8) {
    lVar27 = lVar27 >> 5;
    uVar28 = 0;
    do {
      Transformations::interpolate
                ((AffineSpace3ff *)&local_78.field_1,spaces,(float)uVar28 / (float)(lVar27 - 1));
      local_98.size_active = 0;
      local_98.size_alloced = 0;
      local_98.items = (Vec3fa *)0x0;
      if (sVar10 != 0) {
        local_98.items = (Vec3fa *)alignedMalloc(sVar10 << 4,0x10);
        lVar25 = 0;
        sVar26 = sVar10;
        do {
          pVVar12 = (positions_in->
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar28].items;
          fVar5 = *(float *)((long)&pVVar12->field_0 + lVar25);
          fVar6 = *(float *)((long)&pVVar12->field_0 + lVar25 + 4);
          fVar7 = *(float *)((long)&pVVar12->field_0 + lVar25 + 8);
          pfVar1 = (float *)((long)&(local_98.items)->field_0 + lVar25);
          *pfVar1 = fVar5 * local_78.m128[0] +
                    fVar6 * (float)uStack_68 + fVar7 * local_58 + local_48;
          pfVar1[1] = fVar5 * local_78.m128[1] +
                      fVar6 * uStack_68._4_4_ + fVar7 * fStack_54 + fStack_44;
          pfVar1[2] = fVar5 * local_78.m128[2] +
                      fVar6 * (float)uStack_60 + fVar7 * fStack_50 + fStack_40;
          pfVar1[3] = fVar5 * local_78.m128[3] +
                      fVar6 * uStack_60._4_4_ + fVar7 * fStack_4c + fStack_3c;
          lVar25 = lVar25 + 0x10;
          sVar26 = sVar26 - 1;
          local_98.size_alloced = sVar10;
        } while (sVar26 != 0);
      }
      local_98.size_active = local_98.size_alloced;
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)__return_storage_ptr__,&local_98);
      alignedFree(local_98.items);
      uVar28 = uVar28 + 1;
    } while (uVar28 != lVar27 + (ulong)(lVar27 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<avector<Vec3fa>> transformMSMBlurVec3faBuffer(const std::vector<avector<Vec3fa>>& positions_in, const Transformations& spaces)
    {
      std::vector<avector<Vec3fa>> positions_out;
      const size_t num_time_steps = positions_in.size(); assert(num_time_steps);
      const size_t num_vertices = positions_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vec3fa> verts(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            verts[j] = xfmPoint((AffineSpace3fa)spaces[i],positions_in[0][j]);
          }
          positions_out.push_back(std::move(verts));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vec3fa> verts(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            verts[i] = xfmPoint ((AffineSpace3fa)space,positions_in[t][i]);
          }
          positions_out.push_back(std::move(verts));
        }
      }
      return positions_out;
    }